

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

i8 wherePathSatisfiesOrderBy
             (WhereInfo *pWInfo,ExprList *pOrderBy,WherePath *pPath,u16 wctrlFlags,u16 nLoop,
             WhereLoop *pLast,Bitmask *pRevMask)

{
  ExprList_item *pEVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  int iCur;
  Parse *pParse;
  bool bVar6;
  bool bVar7;
  long lVar8;
  int iVar9;
  WhereTerm *pWVar10;
  CollSeq *pCVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  u32 op;
  Expr *pEVar15;
  ExprList_item *pEVar16;
  ulong uVar17;
  ulong uVar18;
  short sVar19;
  ulong uVar20;
  Expr *pA;
  undefined6 in_register_00000082;
  ulong uVar21;
  uint uVar22;
  WhereLoop *pWVar23;
  ulong uVar24;
  Index *pIVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  uint local_dc;
  ulong local_b0;
  Walker local_60;
  
  if (((int)CONCAT62(in_register_00000082,nLoop) == 0) ||
     ((pWInfo->pParse->db->dbOptFlags & 0x40) == 0)) {
    uVar4 = (ushort)pOrderBy->nExpr;
    uVar17 = (ulong)uVar4;
    uVar18 = 0;
    if (uVar4 < 0x40) {
      op = ((wctrlFlags >> 0xb & 1) != 0) + 0x182;
      uVar18 = uVar17;
      if (uVar4 != 0) {
        uVar14 = ~(-1L << ((byte)uVar4 & 0x3f));
        pEVar1 = pOrderBy->a;
        uVar26 = 0;
        local_b0 = 0;
        uVar24 = 0;
        pWVar23 = (WhereLoop *)0x0;
        uVar21 = 0;
LAB_001886b8:
        if (uVar21 != 0) {
          uVar26 = uVar26 | pWVar23->maskSelf;
        }
        pWVar23 = pLast;
        if ((nLoop <= uVar21) || (pWVar23 = pPath->aLoop[uVar21], (wctrlFlags >> 0xb & 1) == 0)) {
          if ((pWVar23->wsFlags & 0x400) != 0) {
            if ((pWVar23->u).vtab.isOrdered != '\0') {
              uVar24 = uVar14;
            }
            bVar29 = false;
LAB_00188ce9:
            if ((uVar24 != uVar14) && (uVar18 = 0xff, bVar29)) {
              do {
                if ((long)uVar17 < 2) goto LAB_00188d1c;
                uVar17 = uVar17 - 1;
                uVar18 = uVar17;
              } while ((-1L << ((byte)uVar17 & 0x3f) | uVar24) != 0xffffffffffffffff);
            }
            goto LAB_00188d1e;
          }
          (pWVar23->u).btree.nIdxCol = 0;
          iCur = pWInfo->pTabList->a[pWVar23->iTab].iCursor;
          uVar27 = 0;
          do {
            if ((uVar24 >> (uVar27 & 0x3f) & 1) == 0) {
              pEVar15 = pEVar1[uVar27].pExpr;
              while ((pEVar15->flags >> 0xc & 1) != 0) {
                if ((pEVar15->flags >> 0x12 & 1) == 0) {
                  pEVar16 = (ExprList_item *)&pEVar15->pLeft;
                }
                else {
                  pEVar16 = ((pEVar15->x).pList)->a;
                }
                pEVar15 = pEVar16->pExpr;
              }
              if (((pEVar15->op == 0xa2) && (pEVar15->iTable == iCur)) &&
                 (pWVar10 = sqlite3WhereFindTerm
                                      (&pWInfo->sWC,iCur,(int)pEVar15->iColumn,~uVar26,op,
                                       (Index *)0x0), pWVar10 != (WhereTerm *)0x0)) {
                if (pWVar10->eOperator == 1) {
                  if ((ulong)pWVar23->nLTerm != 0) {
                    uVar20 = 0;
                    do {
                      if (pWVar10 == pWVar23->aLTerm[uVar20]) goto LAB_001887e1;
                      uVar20 = uVar20 + 1;
                    } while (pWVar23->nLTerm != uVar20);
                  }
                }
                else {
LAB_001887e1:
                  if ((((pWVar10->eOperator & 0x82) == 0) || (pEVar15->iColumn < 0)) ||
                     (iVar9 = sqlite3ExprCollSeqMatch
                                        (pWInfo->pParse,pEVar1[uVar27].pExpr,pWVar10->pExpr),
                     iVar9 != 0)) {
                    uVar24 = uVar24 | 1L << ((byte)uVar27 & 0x3f);
                  }
                }
              }
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != uVar17);
          if ((pWVar23->wsFlags >> 0xc & 1) == 0) {
            if ((pWVar23->wsFlags >> 8 & 1) != 0) {
              uVar27 = 1;
              pIVar25 = (Index *)0x0;
              bVar29 = true;
              local_dc = 0;
LAB_0018889d:
              uVar20 = 0;
              bVar28 = false;
              bVar13 = 0;
              bVar7 = false;
LAB_001888c8:
              uVar4 = (pWVar23->u).btree.nEq;
              bVar30 = true;
              bVar6 = true;
              if ((uVar4 <= uVar20) || (bVar6 = true, uVar20 < pWVar23->nSkip)) {
LAB_0018894e:
                if (pIVar25 == (Index *)0x0) {
                  uVar22 = 0xffffffff;
                  bVar2 = 0;
                }
                else {
                  sVar19 = pIVar25->aiColumn[uVar20];
                  if (pIVar25->aiColumn[uVar20] == pIVar25->pTable->iPKey) {
                    sVar19 = -1;
                  }
                  bVar2 = pIVar25->aSortOrder[uVar20];
                  uVar22 = (uint)sVar19;
                  if ((((uVar4 <= uVar20) && (bVar29)) && (-1 < sVar19)) &&
                     (pIVar25->pTable->aCol[uVar22].notNull == '\0')) {
                    bVar29 = false;
                  }
                }
                if (bVar30) {
                  uVar12 = 0;
                  do {
                    if ((uVar24 >> (uVar12 & 0x3f) & 1) == 0) {
                      pEVar15 = pEVar1[uVar12].pExpr;
                      pA = pEVar15;
                      while (pA != (Expr *)0x0) {
                        if ((pA->flags >> 0xc & 1) == 0) goto LAB_00188a28;
                        if ((pA->flags >> 0x12 & 1) == 0) {
                          pEVar16 = (ExprList_item *)&pA->pLeft;
                        }
                        else {
                          pEVar16 = ((pA->x).pList)->a;
                        }
                        pA = pEVar16->pExpr;
                      }
                      pA = (Expr *)0x0;
LAB_00188a28:
                      if ((wctrlFlags & 0xc0) == 0) {
                        bVar6 = false;
                      }
                      if ((int)uVar22 < -1) {
                        iVar9 = sqlite3ExprCompareSkip(pA,pIVar25->aColExpr->a[uVar20].pExpr,iCur);
                        if (iVar9 == 0) {
                          pEVar15 = pEVar1[uVar12].pExpr;
                          goto LAB_00188a93;
                        }
                      }
                      else if (((pA->op == 0xa2) && (pA->iTable == iCur)) &&
                              (uVar22 == (int)pA->iColumn)) {
                        if (uVar22 == 0xffffffff) goto LAB_00188ad9;
LAB_00188a93:
                        pParse = pWInfo->pParse;
                        pCVar11 = sqlite3ExprCollSeq(pParse,pEVar15);
                        if (pCVar11 == (CollSeq *)0x0) {
                          pCVar11 = pParse->db->pDfltColl;
                        }
                        iVar9 = sqlite3StrICmp(pCVar11->zName,pIVar25->azColl[uVar20]);
                        if (iVar9 == 0) goto LAB_00188ad9;
                      }
                    }
                    if ((!bVar6) || (uVar12 = uVar12 + 1, uVar17 <= uVar12)) break;
                  } while( true );
                }
                goto LAB_00188b98;
              }
              pWVar10 = pWVar23->aLTerm[uVar20];
              uVar5 = pWVar10->eOperator;
              if ((op & uVar5) == 0) {
                bVar30 = true;
                if ((uVar5 & 1) == 0) {
LAB_00188926:
                  bVar6 = true;
                }
                else {
                  uVar12 = uVar20;
                  do {
                    bVar30 = uVar4 - 1 == uVar12;
                    if (bVar30) goto LAB_00188926;
                    lVar8 = uVar12 + 1;
                    uVar12 = uVar12 + 1;
                    bVar6 = false;
                  } while (pWVar23->aLTerm[lVar8]->pExpr != pWVar10->pExpr);
                }
                goto LAB_0018894e;
              }
              if ((uVar5 >> 8 & 1) != 0) {
                bVar29 = false;
              }
              goto LAB_00188b47;
            }
            pIVar25 = (pWVar23->u).btree.pIndex;
            if ((pIVar25 == (Index *)0x0) || ((pIVar25->field_0x63 & 4) != 0)) goto LAB_00188d1c;
            uVar27 = (ulong)pIVar25->nColumn;
            bVar29 = pIVar25->onError != '\0';
            if (uVar27 != 0) {
              local_dc = (uint)pIVar25->nKeyCol;
              goto LAB_0018889d;
            }
            bVar7 = false;
LAB_00188bbf:
            if (!bVar7 && !bVar29) {
              bVar29 = true;
              goto LAB_00188ce9;
            }
          }
          local_b0 = local_b0 | pWVar23->maskSelf;
          uVar27 = 0;
          pEVar16 = pEVar1;
          do {
            uVar20 = 1L << ((byte)uVar27 & 0x3f);
            if ((uVar24 >> (uVar27 & 0x3f) & 1) == 0) {
              pEVar15 = pEVar16->pExpr;
              if (pEVar15 == (Expr *)0x0) {
                uVar12 = 0;
              }
              else {
                uVar12 = sqlite3WhereExprUsageNN(&pWInfo->sMaskSet,pEVar15);
                if (uVar12 == 0) {
                  local_60.eCode = '\x01';
                  local_60.xExprCallback = exprNodeIsConstant;
                  local_60.xSelectCallback = sqlite3SelectWalkFail;
                  local_60.u.n = 0;
                  walkExpr(&local_60,pEVar15);
                  if (local_60.eCode == '\0') goto LAB_00188c78;
                  uVar12 = 0;
                }
              }
              if ((uVar12 & ~local_b0) != 0) {
                uVar20 = 0;
              }
              uVar24 = uVar24 | uVar20;
            }
LAB_00188c78:
            uVar27 = uVar27 + 1;
            pEVar16 = pEVar16 + 1;
          } while (uVar17 != uVar27);
        }
        bVar29 = false;
        if ((uVar14 <= uVar24) || (bVar28 = nLoop <= uVar21, uVar21 = uVar21 + 1, bVar28))
        goto LAB_00188ce9;
        goto LAB_001886b8;
      }
    }
  }
  else {
LAB_00188d1c:
    uVar18 = 0;
  }
LAB_00188d1e:
  return (i8)uVar18;
LAB_00188ad9:
  (pWVar23->u).btree.nIdxCol = (short)uVar20 + 1;
  if ((wctrlFlags & 0x40) == 0) {
    if (bVar28) {
      bVar28 = true;
      if ((bVar2 ^ bVar13) != pOrderBy->a[uVar12 & 0xffffffff].sortOrder) {
LAB_00188b98:
        if ((uint)uVar20 < local_dc) {
          bVar29 = false;
        }
        if (uVar20 == 0) {
          bVar29 = false;
        }
        goto LAB_00188bbf;
      }
    }
    else {
      bVar3 = pOrderBy->a[uVar12 & 0xffffffff].sortOrder;
      bVar13 = bVar3 ^ bVar2;
      bVar28 = true;
      if (bVar3 != bVar2) {
        *pRevMask = *pRevMask | 1L << ((byte)uVar21 & 0x3f);
      }
    }
  }
  if (uVar22 == 0xffffffff) {
    bVar7 = true;
  }
  uVar24 = uVar24 | 1L << (uVar12 & 0x3f);
LAB_00188b47:
  uVar20 = uVar20 + 1;
  if (uVar20 == uVar27) goto LAB_00188bbf;
  goto LAB_001888c8;
}

Assistant:

static i8 wherePathSatisfiesOrderBy(
  WhereInfo *pWInfo,    /* The WHERE clause */
  ExprList *pOrderBy,   /* ORDER BY or GROUP BY or DISTINCT clause to check */
  WherePath *pPath,     /* The WherePath to check */
  u16 wctrlFlags,       /* WHERE_GROUPBY or _DISTINCTBY or _ORDERBY_LIMIT */
  u16 nLoop,            /* Number of entries in pPath->aLoop[] */
  WhereLoop *pLast,     /* Add this WhereLoop to the end of pPath->aLoop[] */
  Bitmask *pRevMask     /* OUT: Mask of WhereLoops to run in reverse order */
){
  u8 revSet;            /* True if rev is known */
  u8 rev;               /* Composite sort order */
  u8 revIdx;            /* Index sort order */
  u8 isOrderDistinct;   /* All prior WhereLoops are order-distinct */
  u8 distinctColumns;   /* True if the loop has UNIQUE NOT NULL columns */
  u8 isMatch;           /* iColumn matches a term of the ORDER BY clause */
  u16 eqOpMask;         /* Allowed equality operators */
  u16 nKeyCol;          /* Number of key columns in pIndex */
  u16 nColumn;          /* Total number of ordered columns in the index */
  u16 nOrderBy;         /* Number terms in the ORDER BY clause */
  int iLoop;            /* Index of WhereLoop in pPath being processed */
  int i, j;             /* Loop counters */
  int iCur;             /* Cursor number for current WhereLoop */
  int iColumn;          /* A column number within table iCur */
  WhereLoop *pLoop = 0; /* Current WhereLoop being processed. */
  WhereTerm *pTerm;     /* A single term of the WHERE clause */
  Expr *pOBExpr;        /* An expression from the ORDER BY clause */
  CollSeq *pColl;       /* COLLATE function from an ORDER BY clause term */
  Index *pIndex;        /* The index associated with pLoop */
  sqlite3 *db = pWInfo->pParse->db;  /* Database connection */
  Bitmask obSat = 0;    /* Mask of ORDER BY terms satisfied so far */
  Bitmask obDone;       /* Mask of all ORDER BY terms */
  Bitmask orderDistinctMask;  /* Mask of all well-ordered loops */
  Bitmask ready;              /* Mask of inner loops */

  /*
  ** We say the WhereLoop is "one-row" if it generates no more than one
  ** row of output.  A WhereLoop is one-row if all of the following are true:
  **  (a) All index columns match with WHERE_COLUMN_EQ.
  **  (b) The index is unique
  ** Any WhereLoop with an WHERE_COLUMN_EQ constraint on the rowid is one-row.
  ** Every one-row WhereLoop will have the WHERE_ONEROW bit set in wsFlags.
  **
  ** We say the WhereLoop is "order-distinct" if the set of columns from
  ** that WhereLoop that are in the ORDER BY clause are different for every
  ** row of the WhereLoop.  Every one-row WhereLoop is automatically
  ** order-distinct.   A WhereLoop that has no columns in the ORDER BY clause
  ** is not order-distinct. To be order-distinct is not quite the same as being
  ** UNIQUE since a UNIQUE column or index can have multiple rows that 
  ** are NULL and NULL values are equivalent for the purpose of order-distinct.
  ** To be order-distinct, the columns must be UNIQUE and NOT NULL.
  **
  ** The rowid for a table is always UNIQUE and NOT NULL so whenever the
  ** rowid appears in the ORDER BY clause, the corresponding WhereLoop is
  ** automatically order-distinct.
  */

  assert( pOrderBy!=0 );
  if( nLoop && OptimizationDisabled(db, SQLITE_OrderByIdxJoin) ) return 0;

  nOrderBy = pOrderBy->nExpr;
  testcase( nOrderBy==BMS-1 );
  if( nOrderBy>BMS-1 ) return 0;  /* Cannot optimize overly large ORDER BYs */
  isOrderDistinct = 1;
  obDone = MASKBIT(nOrderBy)-1;
  orderDistinctMask = 0;
  ready = 0;
  eqOpMask = WO_EQ | WO_IS | WO_ISNULL;
  if( wctrlFlags & WHERE_ORDERBY_LIMIT ) eqOpMask |= WO_IN;
  for(iLoop=0; isOrderDistinct && obSat<obDone && iLoop<=nLoop; iLoop++){
    if( iLoop>0 ) ready |= pLoop->maskSelf;
    if( iLoop<nLoop ){
      pLoop = pPath->aLoop[iLoop];
      if( wctrlFlags & WHERE_ORDERBY_LIMIT ) continue;
    }else{
      pLoop = pLast;
    }
    if( pLoop->wsFlags & WHERE_VIRTUALTABLE ){
      if( pLoop->u.vtab.isOrdered ) obSat = obDone;
      break;
    }else{
      pLoop->u.btree.nIdxCol = 0;
    }
    iCur = pWInfo->pTabList->a[pLoop->iTab].iCursor;

    /* Mark off any ORDER BY term X that is a column in the table of
    ** the current loop for which there is term in the WHERE
    ** clause of the form X IS NULL or X=? that reference only outer
    ** loops.
    */
    for(i=0; i<nOrderBy; i++){
      if( MASKBIT(i) & obSat ) continue;
      pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
      if( pOBExpr->op!=TK_COLUMN ) continue;
      if( pOBExpr->iTable!=iCur ) continue;
      pTerm = sqlite3WhereFindTerm(&pWInfo->sWC, iCur, pOBExpr->iColumn,
                       ~ready, eqOpMask, 0);
      if( pTerm==0 ) continue;
      if( pTerm->eOperator==WO_IN ){
        /* IN terms are only valid for sorting in the ORDER BY LIMIT 
        ** optimization, and then only if they are actually used
        ** by the query plan */
        assert( wctrlFlags & WHERE_ORDERBY_LIMIT );
        for(j=0; j<pLoop->nLTerm && pTerm!=pLoop->aLTerm[j]; j++){}
        if( j>=pLoop->nLTerm ) continue;
      }
      if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0 && pOBExpr->iColumn>=0 ){
        if( sqlite3ExprCollSeqMatch(pWInfo->pParse, 
                  pOrderBy->a[i].pExpr, pTerm->pExpr)==0 ){
          continue;
        }
        testcase( pTerm->pExpr->op==TK_IS );
      }
      obSat |= MASKBIT(i);
    }

    if( (pLoop->wsFlags & WHERE_ONEROW)==0 ){
      if( pLoop->wsFlags & WHERE_IPK ){
        pIndex = 0;
        nKeyCol = 0;
        nColumn = 1;
      }else if( (pIndex = pLoop->u.btree.pIndex)==0 || pIndex->bUnordered ){
        return 0;
      }else{
        nKeyCol = pIndex->nKeyCol;
        nColumn = pIndex->nColumn;
        assert( nColumn==nKeyCol+1 || !HasRowid(pIndex->pTable) );
        assert( pIndex->aiColumn[nColumn-1]==XN_ROWID
                          || !HasRowid(pIndex->pTable));
        isOrderDistinct = IsUniqueIndex(pIndex);
      }

      /* Loop through all columns of the index and deal with the ones
      ** that are not constrained by == or IN.
      */
      rev = revSet = 0;
      distinctColumns = 0;
      for(j=0; j<nColumn; j++){
        u8 bOnce = 1; /* True to run the ORDER BY search loop */

        assert( j>=pLoop->u.btree.nEq 
            || (pLoop->aLTerm[j]==0)==(j<pLoop->nSkip)
        );
        if( j<pLoop->u.btree.nEq && j>=pLoop->nSkip ){
          u16 eOp = pLoop->aLTerm[j]->eOperator;

          /* Skip over == and IS and ISNULL terms.  (Also skip IN terms when
          ** doing WHERE_ORDERBY_LIMIT processing). 
          **
          ** If the current term is a column of an ((?,?) IN (SELECT...)) 
          ** expression for which the SELECT returns more than one column,
          ** check that it is the only column used by this loop. Otherwise,
          ** if it is one of two or more, none of the columns can be
          ** considered to match an ORDER BY term.  */
          if( (eOp & eqOpMask)!=0 ){
            if( eOp & WO_ISNULL ){
              testcase( isOrderDistinct );
              isOrderDistinct = 0;
            }
            continue;  
          }else if( ALWAYS(eOp & WO_IN) ){
            /* ALWAYS() justification: eOp is an equality operator due to the
            ** j<pLoop->u.btree.nEq constraint above.  Any equality other
            ** than WO_IN is captured by the previous "if".  So this one
            ** always has to be WO_IN. */
            Expr *pX = pLoop->aLTerm[j]->pExpr;
            for(i=j+1; i<pLoop->u.btree.nEq; i++){
              if( pLoop->aLTerm[i]->pExpr==pX ){
                assert( (pLoop->aLTerm[i]->eOperator & WO_IN) );
                bOnce = 0;
                break;
              }
            }
          }
        }

        /* Get the column number in the table (iColumn) and sort order
        ** (revIdx) for the j-th column of the index.
        */
        if( pIndex ){
          iColumn = pIndex->aiColumn[j];
          revIdx = pIndex->aSortOrder[j];
          if( iColumn==pIndex->pTable->iPKey ) iColumn = XN_ROWID;
        }else{
          iColumn = XN_ROWID;
          revIdx = 0;
        }

        /* An unconstrained column that might be NULL means that this
        ** WhereLoop is not well-ordered
        */
        if( isOrderDistinct
         && iColumn>=0
         && j>=pLoop->u.btree.nEq
         && pIndex->pTable->aCol[iColumn].notNull==0
        ){
          isOrderDistinct = 0;
        }

        /* Find the ORDER BY term that corresponds to the j-th column
        ** of the index and mark that ORDER BY term off 
        */
        isMatch = 0;
        for(i=0; bOnce && i<nOrderBy; i++){
          if( MASKBIT(i) & obSat ) continue;
          pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
          testcase( wctrlFlags & WHERE_GROUPBY );
          testcase( wctrlFlags & WHERE_DISTINCTBY );
          if( (wctrlFlags & (WHERE_GROUPBY|WHERE_DISTINCTBY))==0 ) bOnce = 0;
          if( iColumn>=XN_ROWID ){
            if( pOBExpr->op!=TK_COLUMN ) continue;
            if( pOBExpr->iTable!=iCur ) continue;
            if( pOBExpr->iColumn!=iColumn ) continue;
          }else{
            Expr *pIdxExpr = pIndex->aColExpr->a[j].pExpr;
            if( sqlite3ExprCompareSkip(pOBExpr, pIdxExpr, iCur) ){
              continue;
            }
          }
          if( iColumn!=XN_ROWID ){
            pColl = sqlite3ExprNNCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
            if( sqlite3StrICmp(pColl->zName, pIndex->azColl[j])!=0 ) continue;
          }
          pLoop->u.btree.nIdxCol = j+1;
          isMatch = 1;
          break;
        }
        if( isMatch && (wctrlFlags & WHERE_GROUPBY)==0 ){
          /* Make sure the sort order is compatible in an ORDER BY clause.
          ** Sort order is irrelevant for a GROUP BY clause. */
          if( revSet ){
            if( (rev ^ revIdx)!=pOrderBy->a[i].sortOrder ) isMatch = 0;
          }else{
            rev = revIdx ^ pOrderBy->a[i].sortOrder;
            if( rev ) *pRevMask |= MASKBIT(iLoop);
            revSet = 1;
          }
        }
        if( isMatch ){
          if( iColumn==XN_ROWID ){
            testcase( distinctColumns==0 );
            distinctColumns = 1;
          }
          obSat |= MASKBIT(i);
        }else{
          /* No match found */
          if( j==0 || j<nKeyCol ){
            testcase( isOrderDistinct!=0 );
            isOrderDistinct = 0;
          }
          break;
        }
      } /* end Loop over all index columns */
      if( distinctColumns ){
        testcase( isOrderDistinct==0 );
        isOrderDistinct = 1;
      }
    } /* end-if not one-row */

    /* Mark off any other ORDER BY terms that reference pLoop */
    if( isOrderDistinct ){
      orderDistinctMask |= pLoop->maskSelf;
      for(i=0; i<nOrderBy; i++){
        Expr *p;
        Bitmask mTerm;
        if( MASKBIT(i) & obSat ) continue;
        p = pOrderBy->a[i].pExpr;
        mTerm = sqlite3WhereExprUsage(&pWInfo->sMaskSet,p);
        if( mTerm==0 && !sqlite3ExprIsConstant(p) ) continue;
        if( (mTerm&~orderDistinctMask)==0 ){
          obSat |= MASKBIT(i);
        }
      }
    }
  } /* End the loop over all WhereLoops from outer-most down to inner-most */
  if( obSat==obDone ) return (i8)nOrderBy;
  if( !isOrderDistinct ){
    for(i=nOrderBy-1; i>0; i--){
      Bitmask m = MASKBIT(i) - 1;
      if( (obSat&m)==m ) return i;
    }
    return 0;
  }
  return -1;
}